

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

int mspace_mallopt(int param_number,int value)

{
  int iVar1;
  int value_local;
  int param_number_local;
  
  iVar1 = change_mparam(param_number,value);
  return iVar1;
}

Assistant:

int mspace_mallopt(int param_number, int value) {
  return change_mparam(param_number, value);
}